

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O3

int ON_wString::FormatVargsIntoBuffer
              (wchar_t *buffer,size_t buffer_capacity,wchar_t *format,__va_list_tag *args)

{
  uint uVar1;
  wchar_t *__format;
  ulong uVar2;
  va_list args_copy;
  ON_wStringBuffer clang_format_buffer;
  wchar_t clang_format_stack_buffer [128];
  undefined8 local_278;
  void *pvStack_270;
  void *local_268;
  ON_wStringBuffer local_258;
  wchar_t local_238 [130];
  
  uVar1 = 0xffffffff;
  if (buffer_capacity != 0 && buffer != (wchar_t *)0x0) {
    *buffer = L'\0';
    uVar1 = 0;
    if ((format != (wchar_t *)0x0) && (uVar1 = 0, *format != L'\0')) {
      ON_wStringBuffer::ON_wStringBuffer(&local_258,local_238,0x80);
      __format = ConvertToCLangFormat(format,&local_258);
      local_268 = args->reg_save_area;
      local_278._0_4_ = args->gp_offset;
      local_278._4_4_ = args->fp_offset;
      pvStack_270 = args->overflow_arg_area;
      uVar1 = vswprintf(buffer,buffer_capacity,__format,&local_278);
      if (buffer_capacity <= (ulong)(long)(int)uVar1) {
        uVar1 = 0xffffffff;
      }
      uVar2 = 0;
      if (0 < (int)uVar1) {
        uVar2 = (ulong)uVar1;
      }
      buffer[uVar2] = L'\0';
      buffer[buffer_capacity - 1] = L'\0';
      ON_wStringBuffer::~ON_wStringBuffer(&local_258);
    }
  }
  return uVar1;
}

Assistant:

int ON_wString::FormatVargsIntoBuffer(
  wchar_t* buffer,
  size_t buffer_capacity,
  const wchar_t* format,
  va_list args
  )
{
  if (0 == buffer || buffer_capacity <= 0)
    return -1;
  buffer[0] = 0;

  if ( nullptr == format || 0 == format[0] )
    return 0;
  
#if defined(ON_COMPILER_CLANG)
  // CLang requires %ls to properly format a const wchar_t* parameter
  wchar_t clang_format_stack_buffer[128];
  ON_wStringBuffer clang_format_buffer(clang_format_stack_buffer, sizeof(clang_format_stack_buffer) / sizeof(clang_format_stack_buffer[0]));
  format = ConvertToCLangFormat(
    format,
    clang_format_buffer
    );

  va_list args_copy;
  va_copy (args_copy, args);
  // Cannot use Apple's vswprintf_l() because it's buggy. 
  // This means we cannot be certain that a period will be used for a decimal point in formatted printing.
  // For details, see comments below in ON_wString::FormatVargsOutputCount().
  //int len = vswprintf_l(buffer, buffer_capacity, ON_Locale::Ordinal.NumericLocalePtr(), format, args_copy);
  int len = vswprintf(buffer, buffer_capacity, format, args_copy);
  va_end(args_copy);
  
#else

#if defined(ON_COMPILER_GNU)
  va_list args_copy;
  va_copy (args_copy, args);
  int len = vswprintf(buffer, buffer_capacity, format, args_copy);
  va_end(args_copy);
#else
  // Using ON_Locale::Ordinal.NumericLocalePtr() insures that a period 
  // will be use for the decimal point in formatted printing.
  int len = _vswprintf_p_l(buffer, buffer_capacity, format, ON_Locale::Ordinal.NumericLocalePtr(), args);
#endif
#endif
  if (((size_t)len) >= buffer_capacity)
    len = -1;
  buffer[(len <= 0) ? 0 : len] = 0;
  buffer[buffer_capacity - 1] = 0;
  return len;
}